

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock-allocator.h
# Opt level: O1

void __thiscall MockAllocator::MockAllocator(MockAllocator *this)

{
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this);
  (this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_*(unsigned_long)> *)this;
  ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
  ((long)&(this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<unsigned_long> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.current_spec_.
          matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl + 0x10))->next_
       = (linked_ptr_internal *)
         ((long)&(this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.
                 current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
                 super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl + 0x10);
  (this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.current_spec_.matchers_
  .super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173470;
  (this->gmock1_allocate_38).super_FunctionMockerBase<void_*(unsigned_long)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00173b40;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&this->gmock2_deallocate_39);
  (this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.current_spec_.
  function_mocker_ =
       &(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>;
  ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
  ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false> + 8))->value_ =
       (MatcherInterface<unsigned_long> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
          super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false> + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
               super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
               super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false> + 0x10);
  (this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
  super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173470;
  ((linked_ptr<const_testing::MatcherInterface<void_*>_> *)
  ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl + 8))->value_ =
       (MatcherInterface<void_*> *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
          current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
          super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
               super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl + 0x10);
  (this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.current_spec_.
  matchers_.super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>.
  super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.super_MatcherBase<void_*>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001734d8;
  (this->gmock2_deallocate_39).super_FunctionMockerBase<void_(void_*,_unsigned_long)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00173c90;
  return;
}

Assistant:

MockAllocator() {}